

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O0

void __thiscall wasm::Wasm2JSGlue::emitPre(Wasm2JSGlue *this)

{
  bool bVar1;
  reference pvVar2;
  pointer pTVar3;
  address64_t aVar4;
  address64_t aVar5;
  ostream *poVar6;
  Wasm2JSGlue *this_local;
  
  if (((this->flags).emscripten & 1U) == 0) {
    emitPreES6(this);
  }
  else {
    emitPreEmscripten(this);
  }
  bVar1 = isTableExported(this->wasm);
  if (bVar1) {
    Output::operator<<(this->out,(char (*) [23])"function Table(ret) {\n");
    pvVar2 = std::
             vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
             ::operator[](&this->wasm->tables,0);
    pTVar3 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(pvVar2);
    aVar4 = Address::operator_cast_to_unsigned_long(&pTVar3->initial);
    pvVar2 = std::
             vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
             ::operator[](&this->wasm->tables,0);
    pTVar3 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(pvVar2);
    aVar5 = Address::operator_cast_to_unsigned_long(&pTVar3->max);
    if (aVar4 == aVar5) {
      Output::operator<<(this->out,
                         (char (*) [54])"  // grow method not included; table is not growable\n");
    }
    else {
      poVar6 = Output::operator<<(this->out,(char (*) [29])"  ret.grow = function(by) {\n");
      poVar6 = std::operator<<(poVar6,"    var old = this.length;\n");
      poVar6 = std::operator<<(poVar6,"    this.length = this.length + by;\n");
      poVar6 = std::operator<<(poVar6,"    return old;\n");
      std::operator<<(poVar6,"  };\n");
    }
    poVar6 = Output::operator<<(this->out,(char (*) [33])"  ret.set = function(i, func) {\n");
    poVar6 = std::operator<<(poVar6,"    this[i] = func;\n");
    poVar6 = std::operator<<(poVar6,"  };\n");
    poVar6 = std::operator<<(poVar6,"  ret.get = function(i) {\n");
    poVar6 = std::operator<<(poVar6,"    return this[i];\n");
    poVar6 = std::operator<<(poVar6,"  };\n");
    poVar6 = std::operator<<(poVar6,"  return ret;\n");
    std::operator<<(poVar6,"}\n\n");
  }
  emitMemory(this);
  emitSpecialSupport(this);
  return;
}

Assistant:

void Wasm2JSGlue::emitPre() {
  if (flags.emscripten) {
    emitPreEmscripten();
  } else {
    emitPreES6();
  }

  if (isTableExported(wasm)) {
    out << "function Table(ret) {\n";
    if (wasm.tables[0]->initial == wasm.tables[0]->max) {
      out << "  // grow method not included; table is not growable\n";
    } else {
      out << "  ret.grow = function(by) {\n"
          << "    var old = this.length;\n"
          << "    this.length = this.length + by;\n"
          << "    return old;\n"
          << "  };\n";
    }
    out << "  ret.set = function(i, func) {\n"
        << "    this[i] = func;\n"
        << "  };\n"
        << "  ret.get = function(i) {\n"
        << "    return this[i];\n"
        << "  };\n"
        << "  return ret;\n"
        << "}\n\n";
  }

  emitMemory();
  emitSpecialSupport();
}